

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnBrTableExpr
          (BinaryReaderIR *this,Index num_targets,Index *target_depths,Index default_target_depth)

{
  Index IVar1;
  Result RVar2;
  pointer pBVar3;
  reference this_00;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_118;
  Location local_110;
  Var local_f0;
  uint local_a4;
  undefined1 local_a0 [4];
  Index i;
  Var local_80;
  unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> local_38;
  unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> expr;
  Index default_target_depth_local;
  Index *target_depths_local;
  Index num_targets_local;
  BinaryReaderIR *this_local;
  
  expr._M_t.super___uniq_ptr_impl<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::BrTableExpr_*,_std::default_delete<wabt::BrTableExpr>_>.
  super__Head_base<0UL,_wabt::BrTableExpr_*,_false>._M_head_impl._4_4_ = default_target_depth;
  MakeUnique<wabt::BrTableExpr>();
  IVar1 = expr._M_t.
          super___uniq_ptr_impl<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>._M_t.
          super__Tuple_impl<0UL,_wabt::BrTableExpr_*,_std::default_delete<wabt::BrTableExpr>_>.
          super__Head_base<0UL,_wabt::BrTableExpr_*,_false>._M_head_impl._4_4_;
  Location::Location((Location *)local_a0);
  Var::Var(&local_80,IVar1,(Location *)local_a0);
  pBVar3 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::operator->
                     (&local_38);
  Var::operator=(&pBVar3->default_target,&local_80);
  Var::~Var(&local_80);
  pBVar3 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::operator->
                     (&local_38);
  std::vector<wabt::Var,_std::allocator<wabt::Var>_>::resize(&pBVar3->targets,(ulong)num_targets);
  for (local_a4 = 0; local_a4 < num_targets; local_a4 = local_a4 + 1) {
    IVar1 = target_depths[local_a4];
    Location::Location(&local_110);
    Var::Var(&local_f0,IVar1,&local_110);
    pBVar3 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::operator->
                       (&local_38);
    this_00 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::operator[]
                        (&pBVar3->targets,(ulong)local_a4);
    Var::operator=(this_00,&local_f0);
    Var::~Var(&local_f0);
  }
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::BrTableExpr,std::default_delete<wabt::BrTableExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_118,&local_38);
  RVar2 = AppendExpr(this,&local_118);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_118);
  std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::~unique_ptr
            (&local_38);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnBrTableExpr(Index num_targets,
                                     Index* target_depths,
                                     Index default_target_depth) {
  auto expr = MakeUnique<BrTableExpr>();
  expr->default_target = Var(default_target_depth);
  expr->targets.resize(num_targets);
  for (Index i = 0; i < num_targets; ++i) {
    expr->targets[i] = Var(target_depths[i]);
  }
  return AppendExpr(std::move(expr));
}